

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wmb.cpp
# Opt level: O0

void __thiscall merlin::wmb::match_clusters(wmb *this,size_t x,double step)

{
  allocator<merlin::factor> *this_00;
  bool bVar1;
  reference pvVar2;
  size_t sVar3;
  pointer pfVar4;
  reference puVar5;
  reference pvVar6;
  reference pvVar7;
  undefined1 auVar8 [16];
  factor local_540;
  factor local_4e0;
  unsigned_long local_480;
  findex a_3;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_470;
  const_iterator it_3;
  factor local_408;
  undefined1 local_3a8 [8];
  factor bel_1;
  findex a_2;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_338;
  const_iterator it_2;
  size_t i_1;
  factor fmatch_1;
  variable_set var_1;
  undefined1 local_288 [8];
  vector<merlin::factor,_std::allocator<merlin::factor>_> ftmp_1;
  size_t R_1;
  unsigned_long local_208;
  findex a_1;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1f8;
  const_iterator it_1;
  undefined1 local_190 [8];
  factor bel;
  findex a;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_120;
  const_iterator it;
  size_t i;
  factor fmatch;
  variable_set var;
  allocator<merlin::factor> local_61;
  undefined1 local_60 [8];
  vector<merlin::factor,_std::allocator<merlin::factor>_> ftmp;
  size_t R;
  undefined1 local_30 [8];
  variable VX;
  double step_local;
  size_t x_local;
  wmb *this_local;
  
  VX.m_states = (size_t)step;
  pvVar2 = std::
           vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>::
           operator[](&this->m_clusters,x);
  sVar3 = my_set<unsigned_long>::size(pvVar2);
  if (1 < sVar3) {
    _local_30 = graphical_model::var(&this->super_graphical_model,x);
    _R = std::vector<bool,_std::allocator<bool>_>::operator[](&this->m_var_types,x);
    bVar1 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&R);
    if (bVar1) {
      pvVar2 = std::
               vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
               ::operator[](&this->m_clusters,x);
      pfVar4 = (pointer)my_set<unsigned_long>::size(pvVar2);
      ftmp.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pfVar4;
      std::allocator<merlin::factor>::allocator(&local_61);
      std::vector<merlin::factor,_std::allocator<merlin::factor>_>::vector
                ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)local_60,
                 (size_type)pfVar4,&local_61);
      std::allocator<merlin::factor>::~allocator(&local_61);
      variable_set::variable_set((variable_set *)&fmatch.c_);
      variable_set::operator|=((variable_set *)&fmatch.c_,(variable *)local_30);
      factor::factor((factor *)&i,(variable_set *)&fmatch.c_,1.0);
      it._M_current = (unsigned_long *)0x0;
      pvVar2 = std::
               vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
               ::operator[](&this->m_clusters,x);
      local_120._M_current = (unsigned_long *)my_set<unsigned_long>::begin(pvVar2);
      while( true ) {
        pvVar2 = std::
                 vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                 ::operator[](&this->m_clusters,x);
        a = (findex)my_set<unsigned_long>::end(pvVar2);
        bVar1 = __gnu_cxx::operator!=
                          (&local_120,
                           (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)&a);
        if (!bVar1) break;
        puVar5 = __gnu_cxx::
                 __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&local_120);
        bel._88_8_ = *puVar5;
        calc_belief((factor *)local_190,this,bel._88_8_);
        factor::maxmarginal((factor *)&it_1,(factor *)local_190,(variable_set *)&fmatch.c_);
        pvVar6 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                           ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)local_60,
                            (size_type)it._M_current);
        factor::operator=(pvVar6,(factor *)&it_1);
        factor::~factor((factor *)&it_1);
        pvVar6 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                           ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)local_60,
                            (size_type)it._M_current);
        factor::operator*=((factor *)&i,pvVar6);
        factor::~factor((factor *)local_190);
        __gnu_cxx::
        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&local_120);
        it._M_current = it._M_current + 1;
      }
      it._M_current = (unsigned_long *)0x0;
      auVar8._8_4_ = (int)((ulong)ftmp.
                                  super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x20);
      auVar8._0_8_ = ftmp.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
      auVar8._12_4_ = 0x45300000;
      factor::operator^=((factor *)&i,
                         1.0 / ((auVar8._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,
                                                 (int)ftmp.
                                                  super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                ) - 4503599627370496.0)));
      pvVar2 = std::
               vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
               ::operator[](&this->m_clusters,x);
      local_1f8._M_current = (unsigned_long *)my_set<unsigned_long>::begin(pvVar2);
      while( true ) {
        pvVar2 = std::
                 vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                 ::operator[](&this->m_clusters,x);
        a_1 = (findex)my_set<unsigned_long>::end(pvVar2);
        bVar1 = __gnu_cxx::operator!=
                          (&local_1f8,
                           (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)&a_1);
        if (!bVar1) break;
        puVar5 = __gnu_cxx::
                 __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&local_1f8);
        local_208 = *puVar5;
        pvVar6 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                           ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)local_60,
                            (size_type)it._M_current);
        factor::operator/((factor *)&R_1,(factor *)&i,pvVar6);
        pvVar6 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                           (&this->m_reparam,local_208);
        factor::operator*=(pvVar6,(factor *)&R_1);
        factor::~factor((factor *)&R_1);
        __gnu_cxx::
        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&local_1f8);
        it._M_current = it._M_current + 1;
      }
      factor::~factor((factor *)&i);
      variable_set::~variable_set((variable_set *)&fmatch.c_);
      std::vector<merlin::factor,_std::allocator<merlin::factor>_>::~vector
                ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)local_60);
    }
    else {
      pvVar2 = std::
               vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
               ::operator[](&this->m_clusters,x);
      pfVar4 = (pointer)my_set<unsigned_long>::size(pvVar2);
      this_00 = (allocator<merlin::factor> *)((long)&var_1.m_d + 7);
      ftmp_1.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pfVar4;
      std::allocator<merlin::factor>::allocator(this_00);
      std::vector<merlin::factor,_std::allocator<merlin::factor>_>::vector
                ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)local_288,
                 (size_type)pfVar4,this_00);
      std::allocator<merlin::factor>::~allocator
                ((allocator<merlin::factor> *)((long)&var_1.m_d + 7));
      variable_set::variable_set((variable_set *)&fmatch_1.c_);
      variable_set::operator|=((variable_set *)&fmatch_1.c_,(variable *)local_30);
      factor::factor((factor *)&i_1,(variable_set *)&fmatch_1.c_,1.0);
      it_2._M_current = (unsigned_long *)0x0;
      pvVar2 = std::
               vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
               ::operator[](&this->m_clusters,x);
      local_338._M_current = (unsigned_long *)my_set<unsigned_long>::begin(pvVar2);
      while( true ) {
        pvVar2 = std::
                 vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                 ::operator[](&this->m_clusters,x);
        a_2 = (findex)my_set<unsigned_long>::end(pvVar2);
        bVar1 = __gnu_cxx::operator!=
                          (&local_338,
                           (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)&a_2);
        if (!bVar1) break;
        puVar5 = __gnu_cxx::
                 __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&local_338);
        bel_1._88_8_ = *puVar5;
        calc_belief((factor *)local_3a8,this,bel_1._88_8_);
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&this->m_weights,bel_1._88_8_);
        factor::operator^=((factor *)local_3a8,1.0 / *pvVar7);
        factor::marginal(&local_408,(factor *)local_3a8,(variable_set *)&fmatch_1.c_);
        pvVar6 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                           ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)local_288,
                            (size_type)it_2._M_current);
        factor::operator=(pvVar6,&local_408);
        factor::~factor(&local_408);
        pvVar6 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                           ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)local_288,
                            (size_type)it_2._M_current);
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&this->m_weights,bel_1._88_8_);
        factor::operator^((factor *)&it_3,pvVar6,*pvVar7);
        factor::operator*=((factor *)&i_1,(factor *)&it_3);
        factor::~factor((factor *)&it_3);
        factor::~factor((factor *)local_3a8);
        __gnu_cxx::
        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&local_338);
        it_2._M_current = it_2._M_current + 1;
      }
      it_2._M_current = (unsigned_long *)0x0;
      pvVar2 = std::
               vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
               ::operator[](&this->m_clusters,x);
      local_470._M_current = (unsigned_long *)my_set<unsigned_long>::begin(pvVar2);
      while( true ) {
        pvVar2 = std::
                 vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                 ::operator[](&this->m_clusters,x);
        a_3 = (findex)my_set<unsigned_long>::end(pvVar2);
        bVar1 = __gnu_cxx::operator!=
                          (&local_470,
                           (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)&a_3);
        if (!bVar1) break;
        puVar5 = __gnu_cxx::
                 __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&local_470);
        local_480 = *puVar5;
        pvVar6 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                           ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)local_288,
                            (size_type)it_2._M_current);
        factor::operator/(&local_540,(factor *)&i_1,pvVar6);
        sVar3 = VX.m_states;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&this->m_weights,local_480);
        factor::operator^(&local_4e0,&local_540,(double)sVar3 * *pvVar7);
        pvVar6 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                           (&this->m_reparam,local_480);
        factor::operator*=(pvVar6,&local_4e0);
        factor::~factor(&local_4e0);
        factor::~factor(&local_540);
        __gnu_cxx::
        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&local_470);
        it_2._M_current = it_2._M_current + 1;
      }
      factor::~factor((factor *)&i_1);
      variable_set::~variable_set((variable_set *)&fmatch_1.c_);
      std::vector<merlin::factor,_std::allocator<merlin::factor>_>::~vector
                ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)local_288);
    }
  }
  return;
}

Assistant:

void wmb::match_clusters(size_t x, double step) {

	if (m_clusters[x].size() <= 1) {
		return; // no matching
	}

	variable VX = var(x);
	if (m_var_types[x] == true) { // max marginals matching

		size_t R = m_clusters[x].size();
		std::vector<factor> ftmp(R); // compute geometric mean

		variable_set var;
		var |= VX; // on mutual variable (bucket variable)
		factor fmatch(var,1.0);

		size_t i = 0;
		for (flist::const_iterator it = m_clusters[x].begin();
				it != m_clusters[x].end(); ++it, i++) {

			findex a = (*it);
			factor bel = calc_belief(a);
			ftmp[i] = bel.maxmarginal(var); // max-marginal
			fmatch *= ftmp[i];
		}

		i = 0;
		fmatch ^= (1.0/R); // and match each bucket to it
		for (flist::const_iterator it = m_clusters[x].begin();
				it != m_clusters[x].end(); ++it, ++i) {
			findex a = (*it);
			m_reparam[a] *= (fmatch/ftmp[i]);
		}

	} else { // weighted marginals matching

		size_t R = m_clusters[x].size();
		std::vector<factor> ftmp(R);   // compute geometric mean

		variable_set var;
		var |= VX; // on mutual variable (bucket variable)
		factor fmatch(var,1.0);
		size_t i = 0;

		for (flist::const_iterator it = m_clusters[x].begin();
				it != m_clusters[x].end(); ++it, i++) {

			findex a = (*it);
			factor bel = calc_belief(a);
			bel ^= (1.0/m_weights[a]);
			ftmp[i] = bel.marginal(var);
			fmatch *= (ftmp[i] ^ m_weights[a]);
		}

		i = 0;
		for (flist::const_iterator it = m_clusters[x].begin();
				it != m_clusters[x].end(); ++it, ++i) {
			findex a = (*it);
			m_reparam[a] *= ((fmatch/ftmp[i])^(step*m_weights[a]));
		}
	}
}